

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O2

void __thiscall RenX_RelayPlugin::RenX_OnRaw(RenX_RelayPlugin *this,Server *server,string_view line)

{
  _Elt_pointer ppuVar1;
  upstream_server_info *puVar2;
  value_type __c;
  bool bVar3;
  __type_conflict1 _Var4;
  iterator iVar5;
  size_t index;
  long lVar6;
  RenX_RelayPlugin *this_00;
  upstream_server_info *puVar7;
  long lVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view in_message;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view sVar10;
  container_type_conflict tokens;
  string_view line_local;
  string line_sanitized;
  string_view local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __c = (value_type)RenX::DelimC;
  line_local._M_str = line._M_str;
  line_local._M_len = line._M_len;
  line_sanitized._M_dataplus._M_p = (pointer)line_local._M_len;
  line_sanitized._M_string_length = (size_type)line_local._M_str;
  jessilib::split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&tokens,(basic_string_view<char,_std::char_traits<char>_> *)&line_sanitized,
             (value_type)RenX::DelimC);
  if (tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    line_sanitized._M_dataplus._M_p = (pointer)server;
    iVar5 = std::
            _Hashtable<RenX::Server_*,_std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>,_std::__detail::_Select1st,_std::equal_to<RenX::Server_*>,_std::hash<RenX::Server_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_server_info_map)._M_h,(key_type *)&line_sanitized);
    if (iVar5.
        super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (0x80 < (ulong)((long)tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        bVar3 = std::operator==(tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"lRCON");
        if (bVar3) {
          bVar3 = std::operator==(tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,"Command;");
          if (bVar3) {
            bVar3 = std::operator==(tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 3,"executed:");
            if ((bVar3) &&
               (tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length != 0)) {
              bVar9 = (basic_string_view<char,_std::char_traits<char>_>)
                      RenX::Server::getRCONUsername();
              __y._M_str = tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
              __y._M_len = tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length;
              bVar3 = std::operator==(bVar9,__y);
              if (bVar3) {
                ppuVar1 = (this->m_command_tracker).
                          super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur;
                if ((((this->m_command_tracker).
                      super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppuVar1) &&
                    (puVar7 = *ppuVar1, puVar7 != (upstream_server_info *)0x0)) &&
                   (puVar7->m_processing_command == false)) {
                  this_00 = (RenX_RelayPlugin *)
                            (tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4);
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)this_00,
                                          &((puVar7->m_response_queue).
                                            super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                           m_command);
                  if (_Var4) {
                    puVar7->m_processing_command = true;
                    line_sanitized._M_dataplus._M_p = (pointer)&line_sanitized.field_2;
                    line_sanitized._M_string_length = 0;
                    line_sanitized.field_2._M_local_buf[0] = '\0';
                    sVar10 = get_upstream_rcon_username(this_00,puVar7,server);
                    local_58 = sVar10;
                    bVar9 = (basic_string_view<char,_std::char_traits<char>_>)
                            RenX::Server::getRCONUsername();
                    bVar3 = std::operator==(sVar10,bVar9);
                    if (bVar3) {
                      std::__cxx11::string::
                      assign<std::basic_string_view<char,std::char_traits<char>>>
                                ((string *)&line_sanitized,&line_local);
                    }
                    else {
                      std::__cxx11::string::
                      assign<std::basic_string_view<char,std::char_traits<char>>>
                                ((string *)
                                 (tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2),&local_58);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                                (&line_sanitized,
                                 tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      lVar8 = 0x20;
                      for (lVar6 = 1;
                          lVar6 != (long)tokens.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)tokens.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5;
                          lVar6 = lVar6 + 1) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                  (&line_sanitized,__c);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&line_sanitized,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&((tokens.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar8));
                        lVar8 = lVar8 + 0x20;
                      }
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::push_back(&line_sanitized,'\n');
                    in_message._M_str = line_sanitized._M_dataplus._M_p;
                    in_message._M_len = line_sanitized._M_string_length;
                    send_upstream(this,puVar7,in_message,server);
                    std::__cxx11::string::~string((string *)&line_sanitized);
                  }
                }
                goto LAB_00135c73;
              }
              if ((this->m_default_settings).m_suppress_rcon_command_logs != false)
              goto LAB_00135c73;
            }
          }
        }
      }
      puVar2 = *(upstream_server_info **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                       ._M_cur + 0x18);
      for (puVar7 = *(upstream_server_info **)
                     ((long)iVar5.
                            super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                            ._M_cur + 0x10); puVar7 != puVar2; puVar7 = puVar7 + 1) {
        sVar10._M_str = line_local._M_str;
        sVar10._M_len = line_local._M_len;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,&tokens);
        process_renx_message(this,server,puVar7,sVar10,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
    }
  }
LAB_00135c73:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnRaw(RenX::Server &server, std::string_view line) {
	// Not parsing any escape sequences, so data gets sent upstream exactly as it's received here. Copy tokens where needed to process escape sequences.
	auto tokens = jessilib::split(std::string_view{line}, RenX::DelimC);

	// Ensure valid message received
	if (tokens.empty()) {
		return;
	}

	// Check that we already have a session for this server
	auto server_info_map_itr = m_server_info_map.find(&server);
	if (server_info_map_itr == m_server_info_map.end()) {
		// early out: server not yet registered (i.e: finished auth)
		return;
	}

	// Suppress unassociated command execution logs from going upstream
	if (tokens.size() >= 5
		&& tokens[0] == "lRCON"
		&& tokens[1] == "Command;"
		&& tokens[3] == "executed:"
		&& !tokens[4].empty()) {
		if (tokens[2] != server.getRCONUsername()) {
			if (m_default_settings.m_suppress_rcon_command_logs) { // TODO: move away from per-stream settings
				// Suppress RCON command logs from other RCON users
				return;
			}
		}
		else if (m_command_tracker.empty()) {
			// This command response wasn't requested by any current upstream connections; suppress it
			return;
		}
		else {
			upstream_server_info* front_server_info = m_command_tracker.front();
			if (front_server_info == nullptr
				|| front_server_info->m_processing_command
				|| tokens[4] != front_server_info->m_response_queue.front().m_command) {
				// This command response wasn't requested by any current upstream connections; suppress it
				return;
			}

			// This is the next command we're been waiting on; mark processing command and let this go through
			front_server_info->m_processing_command = true;

			// This is a command response for an upstream command; this is only relevant to one server: that server
			// Always echo the command back exactly as it was sent
			std::string line_sanitized;
			const auto& rcon_username = get_upstream_rcon_username(*front_server_info, server);
			if (rcon_username == server.getRCONUsername()) {
				// No need to recombine tokens
				line_sanitized = line;
			}
			else {
				// TODO: add assignment operators to Jupiter::string crap
				tokens[2] = rcon_username;

				// Construct line to send and send it
				line_sanitized = tokens[0];
				for (size_t index = 1; index != tokens.size(); ++index) {
					line_sanitized += RenX::DelimC;
					line_sanitized += tokens[index];
				}
			}
			line_sanitized += '\n';

			send_upstream(*front_server_info, line_sanitized, server);
			return;
		}
	}

	for (auto& server_info : server_info_map_itr->second) {
		// Pass tokens by copy so sanitizations can differ per-upstream
		// TODO: optimize to only copy when needed
		// TODO: only generate sanitized message once if all upstreams are configured the same (i.e: all match default)
		process_renx_message(server, server_info, line, tokens);
	}
}